

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-core.c
# Opt level: O1

gboolean media_player2_call_quit_sync(MediaPlayer2 *proxy,GCancellable *cancellable,GError **error)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  
  uVar1 = g_dbus_proxy_get_type();
  uVar1 = g_type_check_instance_cast(proxy,uVar1);
  uVar2 = g_variant_new("()");
  lVar3 = g_dbus_proxy_call_sync(uVar1,"Quit",uVar2,0,0xffffffff,cancellable,error);
  if (lVar3 != 0) {
    g_variant_get(lVar3,"()");
    g_variant_unref(lVar3);
  }
  return (gboolean)(lVar3 != 0);
}

Assistant:

gboolean
media_player2_call_quit_sync (
    MediaPlayer2 *proxy,
    GCancellable *cancellable,
    GError **error)
{
  GVariant *_ret;
  _ret = g_dbus_proxy_call_sync (G_DBUS_PROXY (proxy),
    "Quit",
    g_variant_new ("()"),
    G_DBUS_CALL_FLAGS_NONE,
    -1,
    cancellable,
    error);
  if (_ret == NULL)
    goto _out;
  g_variant_get (_ret,
                 "()");
  g_variant_unref (_ret);
_out:
  return _ret != NULL;
}